

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeDelete(BtCursor *pCur,u8 flags)

{
  u8 uVar1;
  u8 uVar2;
  char cVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  Btree *pBtree;
  MemPage *pPage;
  u8 *puVar7;
  MemPage *pPage_00;
  long lVar8;
  u16 uVar9;
  int iVar10;
  undefined7 in_register_00000031;
  char cVar11;
  uint uVar12;
  bool bVar13;
  int rc;
  CellInfo info;
  int local_74;
  BtShared *local_70;
  undefined4 local_68;
  Pgno local_64;
  int local_60;
  uint local_5c;
  ulong local_58;
  long local_50;
  CellInfo local_48;
  
  pBtree = pCur->pBtree;
  local_70 = pBtree->pBt;
  local_50 = (long)pCur->iPage;
  uVar4 = pCur->aiIdx[local_50];
  pPage = pCur->apPage[local_50];
  uVar5 = pPage->maskPage;
  uVar1 = pPage->aCellIdx[(ulong)uVar4 * 2];
  uVar2 = pPage->aCellIdx[(ulong)uVar4 * 2 + 1];
  puVar7 = pPage->aData;
  local_68 = (undefined4)CONCAT71((uint7)(byte)(uVar5 >> 8),1);
  local_5c = (uint)CONCAT71(in_register_00000031,flags);
  if ((flags & 2) != 0) {
    if ((pPage->leaf == '\0') ||
       (uVar6 = pPage->nFree, uVar9 = cellSizePtr(pPage,puVar7 + (CONCAT11(uVar1,uVar2) & uVar5)),
       (local_70->usableSize * 2) / 3 < (uint)uVar9 + (uint)uVar6 + 2)) {
      iVar10 = saveCursorKey(pCur);
      if (iVar10 != 0) {
        return iVar10;
      }
      local_74 = 0;
    }
    else {
      local_68 = 0;
    }
  }
  if (pPage->leaf == '\0') {
    local_48.nKey._0_4_ = 0;
    iVar10 = sqlite3BtreePrevious(pCur,(int *)&local_48);
    if (iVar10 != 0) {
      return iVar10;
    }
    local_74 = 0;
    local_60 = 0;
  }
  if (((pCur->curFlags & 0x20) == 0) ||
     (local_74 = saveAllCursors(local_70,pCur->pgnoRoot,pCur), local_74 == 0)) {
    if (pCur->pKeyInfo == (KeyInfo *)0x0) {
      invalidateIncrblobCursors(pBtree,(pCur->info).nKey,0);
    }
    local_74 = sqlite3PagerWrite(pPage->pDbPage);
    if (local_74 == 0) {
      local_74 = clearCell(pPage,puVar7 + (CONCAT11(uVar1,uVar2) & uVar5),&local_48);
      dropCell(pPage,(uint)uVar4,(uint)local_48.nSize,&local_74);
      if (local_74 == 0) {
        if (pPage->leaf == '\0') {
          pPage_00 = pCur->apPage[pCur->iPage];
          uVar12 = (uint)(CONCAT11(pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -2],
                                   pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -1]) &
                         pPage_00->maskPage);
          if (uVar12 < 4) {
            bVar13 = false;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10645,
                        "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
            iVar10 = 0xb;
          }
          else {
            local_64 = pCur->apPage[local_50 + 1]->pgno;
            puVar7 = pPage_00->aData;
            uVar9 = (*pPage_00->xCellSize)(pPage_00,puVar7 + uVar12);
            local_58 = (ulong)uVar9;
            local_70 = (BtShared *)local_70->pTmpSpace;
            local_74 = sqlite3PagerWrite(pPage_00->pDbPage);
            if (local_74 == 0) {
              insertCell(pPage,(uint)uVar4,puVar7 + uVar12 + -4,(int)local_58 + 4,(u8 *)local_70,
                         local_64,&local_74);
            }
            dropCell(pPage_00,pPage_00->nCell - 1,(int)local_58,&local_74);
            bVar13 = local_74 == 0;
            iVar10 = local_60;
            if (!bVar13) {
              iVar10 = local_74;
            }
          }
          if (!bVar13) {
            return iVar10;
          }
        }
        iVar10 = balance(pCur);
        lVar8 = local_50;
        if (iVar10 == 0) {
          cVar11 = (char)local_50;
          local_74 = 0;
          if (cVar11 < pCur->iPage) {
            while (cVar3 = pCur->iPage, cVar11 < cVar3) {
              pCur->iPage = cVar3 + -1;
              if (pCur->apPage[cVar3] != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pCur->apPage[cVar3]->pDbPage);
              }
            }
            iVar10 = balance(pCur);
          }
        }
        local_74 = iVar10;
        if (local_74 == 0) {
          if ((char)local_68 == '\0') {
            pCur->eState = '\x02';
            uVar5 = pPage->nCell;
            if (uVar4 < uVar5) {
              pCur->skipNext = 1;
            }
            else {
              pCur->skipNext = -1;
              pCur->aiIdx[lVar8] = uVar5 - 1;
            }
          }
          else {
            local_74 = moveToRoot(pCur);
            if ((local_5c & 2) != 0) {
              pCur->eState = '\x03';
            }
          }
        }
      }
    }
  }
  return local_74;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur, u8 flags){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;              
  int rc;                              /* Return code */
  MemPage *pPage;                      /* Page to delete cell from */
  unsigned char *pCell;                /* Pointer to cell to delete */
  int iCellIdx;                        /* Index of cell to delete */
  int iCellDepth;                      /* Depth of node containing pCell */ 
  CellInfo info;                       /* Size of the cell being deleted */
  int bSkipnext = 0;                   /* Leaf cursor in SKIPNEXT state */
  u8 bPreserve = flags & BTREE_SAVEPOSITION;  /* Keep cursor valid */

  assert( cursorOwnsBtShared(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );
  assert( pCur->aiIdx[pCur->iPage]<pCur->apPage[pCur->iPage]->nCell );
  assert( pCur->eState==CURSOR_VALID );
  assert( (flags & ~(BTREE_SAVEPOSITION | BTREE_AUXDELETE))==0 );

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->aiIdx[iCellDepth];
  pPage = pCur->apPage[iCellDepth];
  pCell = findCell(pPage, iCellIdx);

  /* If the bPreserve flag is set to true, then the cursor position must
  ** be preserved following this delete operation. If the current delete
  ** will cause a b-tree rebalance, then this is done by saving the cursor
  ** key and leaving the cursor in CURSOR_REQUIRESEEK state before 
  ** returning. 
  **
  ** Or, if the current delete will not cause a rebalance, then the cursor
  ** will be left in CURSOR_SKIPNEXT state pointing to the entry immediately
  ** before or after the deleted entry. In this case set bSkipnext to true.  */
  if( bPreserve ){
    if( !pPage->leaf 
     || (pPage->nFree+cellSizePtr(pPage,pCell)+2)>(int)(pBt->usableSize*2/3)
    ){
      /* A b-tree rebalance will be required after deleting this entry.
      ** Save the cursor key.  */
      rc = saveCursorKey(pCur);
      if( rc ) return rc;
    }else{
      bSkipnext = 1;
    }
  }

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    int notUsed = 0;
    rc = sqlite3BtreePrevious(pCur, &notUsed);
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications.  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 ){
    invalidateIncrblobCursors(p, pCur->info.nKey, 0);
  }

  /* Make the page containing the entry to be deleted writable. Then free any
  ** overflow pages associated with the entry and finally remove the cell
  ** itself from within the page.  */
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  rc = clearCell(pPage, pCell, &info);
  dropCell(pPage, iCellIdx, info.nSize, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->apPage[pCur->iPage];
    int nCell;
    Pgno n = pCur->apPage[iCellDepth+1]->pgno;
    unsigned char *pTmp;

    pCell = findCell(pLeaf, pLeaf->nCell-1);
    if( pCell<&pLeaf->aData[4] ) return SQLITE_CORRUPT_BKPT;
    nCell = pLeaf->xCellSize(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    if( rc==SQLITE_OK ){
      insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    }
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as 
  ** well.  */
  rc = balance(pCur);
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    if( bSkipnext ){
      assert( bPreserve && (pCur->iPage==iCellDepth || CORRUPT_DB) );
      assert( pPage==pCur->apPage[pCur->iPage] || CORRUPT_DB );
      assert( (pPage->nCell>0 || CORRUPT_DB) && iCellIdx<=pPage->nCell );
      pCur->eState = CURSOR_SKIPNEXT;
      if( iCellIdx>=pPage->nCell ){
        pCur->skipNext = -1;
        pCur->aiIdx[iCellDepth] = pPage->nCell-1;
      }else{
        pCur->skipNext = 1;
      }
    }else{
      rc = moveToRoot(pCur);
      if( bPreserve ){
        pCur->eState = CURSOR_REQUIRESEEK;
      }
    }
  }
  return rc;
}